

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::write<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,char16_t *s,
          basic_format_specs<char16_t> *specs,locale_ref param_4)

{
  bool bVar1;
  char16_t *pcVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar3;
  locale_ref in_R9;
  basic_string_view<char16_t> s_00;
  error_handler local_19;
  
  bVar1 = check_cstring_type_spec<fmt::v8::detail::error_handler>(specs->type,&local_19);
  if (bVar1) {
    pcVar2 = (char16_t *)std::char_traits<char16_t>::length(s);
    s_00.size_ = (size_t)specs;
    s_00.data_ = pcVar2;
    bVar3 = write<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                      (out.container,(back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)s,
                       s_00,(basic_format_specs<char16_t> *)0x0,in_R9);
  }
  else {
    bVar3 = write_ptr<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>
                      (out,(unsigned_long)s,specs);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  return check_cstring_type_spec(specs.type)
             ? write(out, basic_string_view<Char>(s), specs, {})
             : write_ptr<Char>(out, to_uintptr(s), &specs);
}